

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wmb.cpp
# Opt level: O1

void __thiscall merlin::wmb::tighten(wmb *this,size_t nIter,double stopTime,double stopObj)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  size_t iter;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  timeval tv;
  timeval local_68;
  double local_58;
  undefined8 uStack_50;
  double local_40;
  double local_38;
  
  local_40 = stopObj;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[WMB] Begin message passing over join graph ...",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  if (nIter == 0) {
    dVar4 = INFINITY;
  }
  else {
    iter = 1;
    dVar4 = INFINITY;
    do {
      auVar6._8_4_ = (int)(iter >> 0x20);
      auVar6._0_8_ = iter;
      auVar6._12_4_ = 0x45300000;
      local_38 = this->m_logz;
      local_58 = dVar4;
      forward(this,1.0 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)iter) - 4503599627370496.0)));
      backward(this,iter);
      update(this);
      dVar5 = this->m_logz;
      dVar4 = dVar5;
      if (local_58 <= dVar5) {
        dVar4 = local_58;
      }
      local_58 = ABS(dVar5 - local_38);
      uStack_50 = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  logZ: ",8);
      lVar1 = std::cout;
      *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb
           | 4;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 0xc;
      *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 6;
      poVar3 = std::ostream::_M_insert<double>(this->m_logz);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
      lVar1 = *(long *)poVar3;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xfffffefb | 0x100;
      *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 8) = 6;
      dVar5 = exp(this->m_logz);
      poVar3 = std::ostream::_M_insert<double>(dVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\td=",3);
      poVar3 = std::ostream::_M_insert<double>(local_58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t time=",7);
      lVar1 = *(long *)poVar3;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 8) = 6;
      gettimeofday(&local_68,(__timezone_ptr_t)0x0);
      poVar3 = std::ostream::_M_insert<double>
                         (((double)local_68.tv_usec / 1000000.0 + (double)local_68.tv_sec) -
                          (this->super_algorithm).m_start_time);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\ti=",3);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    } while ((local_40 <= local_58) &&
            (((stopTime <= 0.0 ||
              (gettimeofday(&local_68,(__timezone_ptr_t)0x0),
              ((double)local_68.tv_usec / 1000000.0 + (double)local_68.tv_sec) -
              (this->super_algorithm).m_start_time < stopTime)) && (iter = iter + 1, iter <= nIter))
            ));
  }
  this->m_logz = dVar4;
  return;
}

Assistant:

void wmb::tighten(size_t nIter, double stopTime, double stopObj) {
	std::cout << "[WMB] Begin message passing over join graph ..." << std::endl;

	double minZ = infty();
	for (size_t iter = 1; iter <= nIter; ++iter) {
		double step = 1.0/(double)iter;
		double prevZ = m_logz;

		forward(step);
		backward(iter);
		update();

		// keep track of tightest upper bound
		if (m_logz < minZ) {
			minZ = m_logz;
		}

		double dObj = fabs(m_logz - prevZ);
		std::cout << "  logZ: " << std::fixed
				<< std::setw(12) << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ") ";
		std::cout << "\td=" << dObj << "\t time="  << std::fixed
			<< std::setprecision(MERLIN_PRECISION) << (timeSystem() - m_start_time)
			<< "\ti=" << iter << std::endl;

		if (dObj < stopObj) {
			break;
		}

		// do at least one iterations
		if (stopTime > 0 && stopTime <= (timeSystem() - m_start_time)) {
			break;
		}
	} // end for

	m_logz = minZ; // keep tightest upper bound
}